

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O1

void Abc_TtStoreLoadSaveBin(char *pFileName)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  void *__ptr;
  char *__s;
  char *__filename;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  
  __ptr = calloc(0x800,4);
  __s = (char *)calloc(0x10000,1);
  __filename = Extra_FileNameGenericAppend(pFileName,"_binary.data");
  __stream = fopen(pFileName,"rb");
  __stream_00 = fopen(__filename,"wb");
  if (__stream == (FILE *)0x0) {
    return;
  }
  uVar7 = 0xffffffff;
  do {
    pcVar4 = fgets(__s,0x10000,__stream);
    if (pcVar4 == (char *)0x0) {
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      if (__s != (char *)0x0) {
        free(__s);
      }
      fclose(__stream);
      fclose(__stream_00);
      printf("Input file \"%s\" was copied into output file \"%s\".\n",pFileName,__filename);
      return;
    }
    sVar5 = strlen(__s);
    uVar9 = (int)sVar5 - 1;
    uVar3 = uVar9;
    if (1 < uVar9) {
      uVar3 = (int)sVar5 - 2;
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        uVar2 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        uVar3 = (uVar2 ^ 0xffffffe0) + 0x21;
      }
    }
    iVar8 = (((int)uVar9 >> 5) + 1) - (uint)((uVar9 & 0x1f) == 0);
    if (uVar9 != 1 << ((byte)uVar3 & 0x1f)) {
      __assert_fail("Len == (1 << nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDec.c"
                    ,0x1e8,"void Abc_TtStoreLoadSaveBin(char *)");
    }
    uVar2 = uVar3;
    if ((uVar7 != 0xffffffff) && (uVar2 = uVar7, uVar7 != uVar3)) {
      __assert_fail("nVarsAll == nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDec.c"
                    ,0x1ec,"void Abc_TtStoreLoadSaveBin(char *)");
    }
    uVar7 = uVar2;
    sVar5 = (long)iVar8 << 2;
    memset(__ptr,0,sVar5);
    if (0 < (int)uVar9) {
      uVar6 = 0;
      do {
        if (__s[uVar6] != '0') {
          if (__s[uVar6] != '1') {
            __assert_fail("pBuffer[i] == \'0\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDec.c"
                          ,0x1f2,"void Abc_TtStoreLoadSaveBin(char *)");
          }
          puVar1 = (uint *)((long)__ptr + (uVar6 >> 5 & 0x7ffffff) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)uVar6 & 0x1f);
        }
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar6);
    }
    sVar5 = fwrite(__ptr,1,sVar5,__stream_00);
  } while (iVar8 * 4 == (int)sVar5);
  __assert_fail("Value == (int)sizeof(int) * nInts",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDec.c"
                ,500,"void Abc_TtStoreLoadSaveBin(char *)");
}

Assistant:

void Abc_TtStoreLoadSaveBin( char * pFileName )
{ 
    unsigned * pTruth = ABC_CALLOC( unsigned, (1 << 11) );
    char * pBuffer = ABC_CALLOC( char, (1 << 16) );
    char * pFileInput  = pFileName;
    char * pFileOutput = Extra_FileNameGenericAppend(pFileName, "_binary.data");
    FILE * pFileI = fopen( pFileInput,  "rb" );
    FILE * pFileO = fopen( pFileOutput, "wb" );
    int i, Value, nVarsAll = -1;
    if ( pFileI == NULL )
        return;
    while ( fgets(pBuffer, (1 << 16), pFileI) )
    {
        int Len   = strlen(pBuffer)-1; // subtract 1 for end-of-line
        int nVars = Abc_Base2Log(Len);
        int nInts = Abc_BitWordNum(Len);
        assert( Len == (1 << nVars) );
        if ( nVarsAll == -1 )
            nVarsAll = nVars;
        else
            assert( nVarsAll == nVars );
        memset( pTruth, 0, sizeof(int)*nInts );
        for ( i = 0; i < Len; i++ )
            if ( pBuffer[i] == '1' )
                Abc_InfoSetBit( pTruth, i );
            else
                assert( pBuffer[i] == '0' );
        Value = fwrite( pTruth, 1, sizeof(int) * nInts, pFileO );
        assert( Value == (int)sizeof(int) * nInts );
    }
    ABC_FREE( pTruth );
    ABC_FREE( pBuffer );
    fclose( pFileI );
    fclose( pFileO );
    printf( "Input file \"%s\" was copied into output file \"%s\".\n", pFileInput, pFileOutput );
}